

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QByteArray * __thiscall QMetaEnumBuilder::name(QMetaEnumBuilder *this)

{
  QMetaEnumBuilderPrivate *pQVar1;
  QByteArray *in_RDI;
  QMetaEnumBuilderPrivate *d;
  QByteArray *this_00;
  QMetaEnumBuilder *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  pQVar1 = d_func(in_stack_ffffffffffffffe8);
  if (pQVar1 == (QMetaEnumBuilderPrivate *)0x0) {
    QByteArray::QByteArray((QByteArray *)0x3797fe);
  }
  else {
    QByteArray::QByteArray(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

QByteArray QMetaEnumBuilder::name() const
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d)
        return d->name;
    else
        return QByteArray();
}